

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
          (StringTree *this,anon_class_8_1_6ec8c47f *func)

{
  Branch *pBVar1;
  size_t sVar2;
  size_t in_RDX;
  size_t extraout_RDX;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  StringTree *this_00;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  
  pBVar1 = (this->branches).ptr;
  uVar5 = 0;
  for (lVar4 = (this->branches).size_ << 6; this_00 = &pBVar1->content, lVar4 != 0;
      lVar4 = lVar4 + -0x40) {
    part.ptr = (char *)(*(ulong *)((long)(this_00 + -1) + 0x30) - uVar5);
    if (uVar5 <= *(ulong *)((long)(this_00 + -1) + 0x30) && part.ptr != (char *)0x0) {
      part.size_ = in_RDX;
      kj::_::anon_unknown_0::TestCase29::run::anon_class_8_1_6ec8c47f::operator()(func,part);
      uVar5 = *(ulong *)((long)(this_00 + -1) + 0x30);
    }
    visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>(this_00,func);
    pBVar1 = (Branch *)(this_00 + 1);
    in_RDX = extraout_RDX;
  }
  sVar2 = (this->text).content.size_;
  uVar3 = 0;
  if (sVar2 != 0) {
    uVar3 = sVar2 - 1;
  }
  part_00.ptr = (char *)(uVar3 - uVar5);
  if (uVar5 <= uVar3 && part_00.ptr != (char *)0x0) {
    part_00.size_ = in_RDX;
    kj::_::anon_unknown_0::TestCase29::run::anon_class_8_1_6ec8c47f::operator()(func,part_00);
    return;
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}